

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.cpp
# Opt level: O0

bool __thiscall wasm::String::convertWTF8ToWTF16(String *this,ostream *os,string_view str)

{
  ostream *os_00;
  bool bVar1;
  size_type sVar2;
  uint *puVar3;
  bool local_37;
  bool isTrailingSurrogate;
  _Optional_payload_base<unsigned_int> _Stack_34;
  bool isLeadingSurrogate;
  _Optional_payload_base<unsigned_int> local_2c;
  optional<unsigned_int> u;
  bool lastWasLeadingSurrogate;
  bool valid;
  ostream *os_local;
  string_view str_local;
  
  str_local._M_len = str._M_len;
  u.super__Optional_base<unsigned_int,_true,_true>._M_payload.
  super__Optional_payload_base<unsigned_int>._M_payload._M_value._3_1_ = 1;
  u.super__Optional_base<unsigned_int,_true,_true>._M_payload.
  super__Optional_payload_base<unsigned_int>._M_payload._M_value._2_1_ = 0;
  unique0x10000139 = this;
  os_local = os;
  while( true ) {
    sVar2 = std::basic_string_view<char,_std::char_traits<char>_>::size
                      ((basic_string_view<char,_std::char_traits<char>_> *)&os_local);
    if (sVar2 == 0) break;
    local_2c = (_Optional_payload_base<unsigned_int>)
               anon_unknown_0::takeWTF8CodePoint((string_view *)&os_local);
    bVar1 = std::optional::operator_cast_to_bool((optional *)&local_2c);
    if (!bVar1) {
      u.super__Optional_base<unsigned_int,_true,_true>._M_payload.
      super__Optional_payload_base<unsigned_int>._M_payload._M_value._3_1_ = 0;
      std::optional<unsigned_int>::optional<const_unsigned_int_&,_true>
                ((optional<unsigned_int> *)&stack0xffffffffffffffcc,
                 &(anonymous_namespace)::replacementCharacter);
      local_2c = _Stack_34;
    }
    puVar3 = std::optional<unsigned_int>::operator*((optional<unsigned_int> *)&local_2c);
    local_37 = false;
    if (0xd7ff < *puVar3) {
      puVar3 = std::optional<unsigned_int>::operator*((optional<unsigned_int> *)&local_2c);
      local_37 = *puVar3 < 0xdc00;
    }
    puVar3 = std::optional<unsigned_int>::operator*((optional<unsigned_int> *)&local_2c);
    bVar1 = false;
    if (0xdbff < *puVar3) {
      puVar3 = std::optional<unsigned_int>::operator*((optional<unsigned_int> *)&local_2c);
      bVar1 = *puVar3 < 0xe000;
    }
    os_00 = (ostream *)stack0xffffffffffffffe0;
    if (((u.super__Optional_base<unsigned_int,_true,_true>._M_payload.
          super__Optional_payload_base<unsigned_int>._M_payload._M_value._2_1_ & 1) != 0) && (bVar1)
       ) {
      u.super__Optional_base<unsigned_int,_true,_true>._M_payload.
      super__Optional_payload_base<unsigned_int>._M_payload._M_value._3_1_ = 0;
    }
    u.super__Optional_base<unsigned_int,_true,_true>._M_payload.
    super__Optional_payload_base<unsigned_int>._M_payload._M_value._2_1_ = local_37;
    puVar3 = std::optional<unsigned_int>::operator*((optional<unsigned_int> *)&local_2c);
    writeWTF16CodePoint(os_00,*puVar3);
  }
  return (bool)(u.super__Optional_base<unsigned_int,_true,_true>._M_payload.
                super__Optional_payload_base<unsigned_int>._M_payload._M_value._3_1_ & 1);
}

Assistant:

bool convertWTF8ToWTF16(std::ostream& os, std::string_view str) {
  bool valid = true;
  bool lastWasLeadingSurrogate = false;

  while (str.size()) {
    auto u = takeWTF8CodePoint(str);
    if (!u) {
      valid = false;
      u = replacementCharacter;
    }

    bool isLeadingSurrogate = 0xD800 <= *u && *u < 0xDC00;
    bool isTrailingSurrogate = 0xDC00 <= *u && *u < 0xE000;
    if (lastWasLeadingSurrogate && isTrailingSurrogate) {
      // Invalid surrogate sequence.
      valid = false;
    }
    lastWasLeadingSurrogate = isLeadingSurrogate;

    writeWTF16CodePoint(os, *u);
  }

  return valid;
}